

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

void __thiscall
slang::SmallVectorBase<(anonymous_namespace)::Constructable>::resize
          (SmallVectorBase<(anonymous_namespace)::Constructable> *this,size_t newSize,
          Constructable *value)

{
  int iVar1;
  ulong uVar2;
  size_type sVar3;
  long lVar4;
  pointer pCVar5;
  int iVar6;
  pointer pCVar7;
  long lVar8;
  ulong uVar9;
  Constructable *this_00;
  Constructable temp;
  Constructable local_30;
  
  uVar9 = this->len;
  lVar4 = newSize - uVar9;
  if (newSize < uVar9) {
    this_00 = this->data_ + newSize;
    lVar4 = uVar9 * 8 + newSize * -8;
    do {
      anon_unknown.dwarf_d92100::Constructable::~Constructable(this_00);
      this_00 = this_00 + 1;
      lVar4 = lVar4 + -8;
    } while (lVar4 != 0);
  }
  else {
    if (newSize < uVar9 || lVar4 == 0) {
      return;
    }
    uVar2 = this->cap;
    if (uVar2 < newSize) {
      local_30.constructed = true;
      iVar1 = value->value;
      (anonymous_namespace)::Constructable::numConstructorCalls =
           (anonymous_namespace)::Constructable::numConstructorCalls + 1;
      (anonymous_namespace)::Constructable::numCopyConstructorCalls =
           (anonymous_namespace)::Constructable::numCopyConstructorCalls + 1;
      local_30.value = iVar1;
      if (newSize >> 0x3c == 0) {
        uVar9 = uVar2 * 2;
        if (uVar2 * 2 <= newSize) {
          uVar9 = newSize;
        }
        if (0xfffffffffffffff - uVar2 < uVar2) {
          uVar9 = 0xfffffffffffffff;
        }
        pCVar7 = (pointer)newSize;
        pCVar5 = (pointer)operator_new(uVar9 * 8);
        sVar3 = this->len;
        if (sVar3 != 0) {
          pCVar7 = this->data_;
          iVar6 = 0;
          lVar4 = 0;
          do {
            (&pCVar5->constructed)[lVar4] = true;
            *(undefined4 *)((long)&pCVar5->value + lVar4) =
                 *(undefined4 *)((long)&pCVar7->value + lVar4);
            *(undefined4 *)((long)&pCVar7->value + lVar4) = 0;
            lVar4 = lVar4 + 8;
            iVar6 = iVar6 + -1;
          } while (sVar3 * 8 - lVar4 != 0);
          (anonymous_namespace)::Constructable::numConstructorCalls =
               (anonymous_namespace)::Constructable::numConstructorCalls - iVar6;
          pCVar7 = (pointer)(ulong)(anonymous_namespace)::Constructable::numConstructorCalls;
          (anonymous_namespace)::Constructable::numMoveConstructorCalls =
               (anonymous_namespace)::Constructable::numMoveConstructorCalls - iVar6;
        }
        lVar4 = newSize - sVar3;
        if (0 < lVar4) {
          pCVar7 = pCVar5 + sVar3;
          lVar8 = lVar4 + 1;
          do {
            pCVar7->constructed = true;
            pCVar7->value = iVar1;
            pCVar7 = pCVar7 + 1;
            lVar8 = lVar8 + -1;
          } while (1 < lVar8);
          (anonymous_namespace)::Constructable::numConstructorCalls =
               (anonymous_namespace)::Constructable::numConstructorCalls + (int)lVar4;
          (anonymous_namespace)::Constructable::numCopyConstructorCalls =
               (anonymous_namespace)::Constructable::numCopyConstructorCalls + (int)lVar4;
        }
        cleanup(this,(EVP_PKEY_CTX *)pCVar7);
        this->len = newSize;
        this->cap = uVar9;
        this->data_ = pCVar5;
        anon_unknown.dwarf_d92100::Constructable::~Constructable(&local_30);
        return;
      }
      detail::throwLengthError();
    }
    if (0 < lVar4) {
      pCVar7 = this->data_ + uVar9;
      lVar8 = lVar4 + 1;
      do {
        pCVar7->constructed = true;
        pCVar7->value = value->value;
        pCVar7 = pCVar7 + 1;
        lVar8 = lVar8 + -1;
      } while (1 < lVar8);
      (anonymous_namespace)::Constructable::numConstructorCalls =
           (anonymous_namespace)::Constructable::numConstructorCalls + (int)lVar4;
      (anonymous_namespace)::Constructable::numCopyConstructorCalls =
           (anonymous_namespace)::Constructable::numCopyConstructorCalls + (int)lVar4;
    }
  }
  this->len = newSize;
  return;
}

Assistant:

void resize(size_t newSize, const T& value) { resizeImpl(newSize, value); }